

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_buffer.h
# Opt level: O1

void mask_write_buffer(cio_write_buffer *write_buffer,uint8_t *mask,size_t mask_length)

{
  ulong *puVar1;
  byte *pbVar2;
  uint8_t uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  byte bVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong local_20;
  
  sVar4 = (write_buffer->data).head.q_len;
  if (sVar4 != 0) {
    sVar7 = 0;
    do {
      write_buffer = write_buffer->next;
      sVar5 = (write_buffer->data).head.q_len;
      uVar6 = (write_buffer->data).element.length;
      local_20 = 0;
      if (uVar6 < 8) {
        if (uVar6 != 0) {
          uVar13 = 0;
          do {
            *(byte *)(sVar5 + uVar13) = *(byte *)(sVar5 + uVar13) ^ mask[(uint)uVar13 & 3];
            uVar13 = uVar13 + 1;
          } while (uVar6 != uVar13);
        }
      }
      else {
        uVar14 = (ulong)(-(int)sVar5 & 7);
        uVar13 = uVar6 - uVar14;
        lVar9 = 0;
        do {
          *(uint8_t *)((long)&local_20 + lVar9) = mask[(int)lVar9 - (int)sVar5 & 3];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
        if (uVar14 != 0) {
          lVar9 = 0;
          do {
            *(byte *)(sVar5 + lVar9) = *(byte *)(sVar5 + lVar9) ^ mask[(uint)lVar9 & 3];
            lVar9 = lVar9 + 1;
          } while (((byte)-(char)sVar5 & 7) != (uint)lVar9);
        }
        if (7 < uVar13) {
          uVar15 = 0;
          do {
            puVar1 = (ulong *)(uVar14 + sVar5 + uVar15 * 8);
            *puVar1 = *puVar1 ^ local_20;
            uVar15 = uVar15 + 1;
          } while (uVar13 >> 3 != uVar15);
        }
        uVar13 = (ulong)((uint)uVar13 & 7);
        if (uVar6 - uVar13 < uVar6) {
          lVar9 = -uVar13;
          do {
            pbVar2 = (byte *)(sVar5 + uVar6 + lVar9);
            *pbVar2 = *pbVar2 ^ mask[(int)uVar6 + (int)lVar9 & 3];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0);
        }
      }
      bVar10 = *(byte *)((long)&write_buffer->data + 8);
      bVar12 = bVar10 & 3;
      if ((bVar10 & 3) != 0) {
        bVar8 = 0;
        bVar10 = bVar10 & 3;
        do {
          uVar3 = mask[bVar8];
          mask[bVar8] = mask[bVar12];
          mask[bVar12] = uVar3;
          bVar8 = bVar8 + 1;
          bVar12 = bVar12 + 1;
          bVar11 = bVar10;
          if (bVar8 == bVar10) {
            bVar11 = bVar12;
          }
          if (3 < bVar12) {
            bVar12 = bVar10;
            bVar11 = bVar10;
          }
          bVar10 = bVar11;
        } while (bVar8 != bVar12);
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != sVar4);
  }
  return;
}

Assistant:

static inline size_t cio_write_buffer_get_num_buffer_elements(const struct cio_write_buffer *head)
{
	return head->data.head.q_len;
}